

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonMaximumSuppression.pb.cc
# Opt level: O0

void CoreML::Specification::protobuf_NonMaximumSuppression_2eproto::TableStruct::Shutdown(void)

{
  google::protobuf::internal::
  ExplicitlyConstructed<CoreML::Specification::NonMaximumSuppression_PickTop>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::NonMaximumSuppression_PickTop> *)
             _NonMaximumSuppression_PickTop_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::NonMaximumSuppression>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::NonMaximumSuppression> *)
           _NonMaximumSuppression_default_instance_);
  return;
}

Assistant:

void TableStruct::Shutdown() {
  _NonMaximumSuppression_PickTop_default_instance_.Shutdown();
  _NonMaximumSuppression_default_instance_.Shutdown();
}